

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CloseCurrentPopup(void)

{
  ImGuiID IVar1;
  value_type *pvVar2;
  int iVar3;
  ImVector<ImGuiPopupRef> *this;
  
  iVar3 = (GImGui->CurrentPopupStack).Size;
  if ((0 < iVar3) && (iVar3 <= (GImGui->OpenPopupStack).Size)) {
    iVar3 = iVar3 + -1;
    this = &GImGui->OpenPopupStack;
    pvVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->CurrentPopupStack,iVar3);
    IVar1 = pvVar2->PopupId;
    pvVar2 = ImVector<ImGuiPopupRef>::operator[](this,iVar3);
    if (IVar1 == pvVar2->PopupId) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        pvVar2 = ImVector<ImGuiPopupRef>::operator[](this,iVar3);
        if (pvVar2->Window == (ImGuiWindow *)0x0) goto LAB_0017a125;
        pvVar2 = ImVector<ImGuiPopupRef>::operator[](this,iVar3);
        if ((pvVar2->Window->Flags & 0x10000000) == 0) goto LAB_0017a125;
      }
      iVar3 = 0;
LAB_0017a125:
      ClosePopupToLevel(iVar3);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.CurrentPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.CurrentPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx);
}